

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O0

void FastPForLib::Simple9<true,_false>::unpack7_4(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *pin;
  uint32_t *pout;
  uint32_t **in_local;
  uint32_t **out_local;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0x15 & 0x7f;
  puVar1[1] = *puVar2 >> 0xe & 0x7f;
  puVar1[2] = *puVar2 >> 7 & 0x7f;
  puVar1[3] = *puVar2 & 0x7f;
  *in = puVar2 + 1;
  *out = puVar1 + 4;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack7_4(uint32_t **out,
                                            const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 21) & 0x7f;
  pout[1] = (pin[0] >> 14) & 0x7f;
  pout[2] = (pin[0] >> 7) & 0x7f;
  pout[3] = pin[0] & 0x7f;

  *in = pin + 1;
  *out = pout + 4;
}